

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.h
# Opt level: O0

size_t __thiscall wasm::PossibleContents::hash(PossibleContents *this)

{
  bool bVar1;
  char *__val;
  add_pointer_t<const_wasm::PossibleContents::ConeType> value;
  int in_EDX;
  char *in_RSI;
  ConeType *coneType;
  Literal local_38;
  hash<unsigned_long> local_19;
  size_t local_18;
  size_t ret;
  PossibleContents *this_local;
  
  ret = (size_t)this;
  __val = std::
          variant<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
          ::index(&this->value,in_RSI,in_EDX);
  local_18 = std::hash<unsigned_long>::operator()(&local_19,(unsigned_long)__val);
  bVar1 = isNone(this);
  if ((!bVar1) && (bVar1 = isMany(this), !bVar1)) {
    bVar1 = isLiteral(this);
    if (bVar1) {
      getLiteral(&local_38,this);
      rehash<wasm::Literal>(&local_18,&local_38);
      wasm::Literal::~Literal(&local_38);
    }
    else {
      bVar1 = isGlobal(this);
      if (bVar1) {
        _coneType = (string_view)getGlobal(this);
        rehash<wasm::Name>(&local_18,(Name *)&coneType);
      }
      else {
        value = std::
                get_if<wasm::PossibleContents::ConeType,wasm::PossibleContents::None,wasm::Literal,wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::ConeType,wasm::PossibleContents::Many>
                          (&this->value);
        if (value == (add_pointer_t<const_wasm::PossibleContents::ConeType>)0x0) {
          wasm::handle_unreachable
                    ("bad variant",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/possible-contents.h"
                     ,0x13b);
        }
        else {
          rehash<wasm::Type>(&local_18,&value->type);
          rehash<unsigned_int>(&local_18,&value->depth);
        }
      }
    }
  }
  return local_18;
}

Assistant:

size_t hash() const {
    // First hash the index of the variant, then add the internals for each.
    size_t ret = std::hash<size_t>()(value.index());
    if (isNone() || isMany()) {
      // Nothing to add.
    } else if (isLiteral()) {
      rehash(ret, getLiteral());
    } else if (isGlobal()) {
      rehash(ret, getGlobal());
    } else if (auto* coneType = std::get_if<ConeType>(&value)) {
      rehash(ret, coneType->type);
      rehash(ret, coneType->depth);
    } else {
      WASM_UNREACHABLE("bad variant");
    }
    return ret;
  }